

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<pybind11::detail::iterator_state<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>,_true,_(pybind11::return_value_policy)6>_>
     ::init_instance(instance *inst,void *holder_ptr)

{
  bool bVar1;
  holder_type *in_RDI;
  value_and_holder v_h;
  void *in_stack_ffffffffffffffa8;
  instance *in_stack_ffffffffffffffb0;
  holder_type *in_stack_ffffffffffffffb8;
  holder_type *holder_ptr_00;
  type_index in_stack_ffffffffffffffc8;
  instance *in_stack_ffffffffffffffd0;
  
  holder_ptr_00 = in_RDI;
  std::type_index::type_index
            ((type_index *)&stack0xffffffffffffffc8,
             (type_info *)
             &pybind11::detail::
              iterator_state<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>,std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>,true,(pybind11::return_value_policy)6>
              ::typeinfo);
  pybind11::detail::get_type_info((type_index *)holder_ptr,v_h.vh._7_1_);
  pybind11::detail::instance::get_value_and_holder
            ((instance *)CONCAT17(v_h.vh._7_1_,v_h.vh._0_7_),v_h.type,v_h.index._7_1_);
  bVar1 = pybind11::detail::value_and_holder::instance_registered
                    ((value_and_holder *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    pybind11::detail::value_and_holder::value_ptr<void>
              ((value_and_holder *)&stack0xffffffffffffffd0);
    pybind11::detail::register_instance
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(type_info *)0x393510);
    pybind11::detail::value_and_holder::set_instance_registered
              ((value_and_holder *)&stack0xffffffffffffffd0,true);
    in_stack_ffffffffffffffb8 = in_RDI;
  }
  pybind11::detail::value_and_holder::
  value_ptr<pybind11::detail::iterator_state<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>,std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>,true,(pybind11::return_value_policy)6>>
            ((value_and_holder *)&stack0xffffffffffffffd0);
  init_holder(in_stack_ffffffffffffffd0,(value_and_holder *)in_stack_ffffffffffffffc8._M_target,
              holder_ptr_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }